

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-decimal128.c
# Opt level: O1

_Bool bson_decimal128_from_string(char *string,bson_decimal128_t *dec)

{
  char cVar1;
  ushort *puVar2;
  char *pcVar3;
  _Bool _Var4;
  undefined1 extraout_AL;
  undefined1 uVar5;
  int iVar6;
  ushort **ppuVar7;
  char *in_RCX;
  long lVar8;
  undefined4 extraout_EDX;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 unaff_RBX;
  undefined8 uVar12;
  short *psVar13;
  ulong uVar14;
  bool bVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ushort uVar22;
  char *pcVar23;
  bool bVar24;
  int nread;
  uint16_t digits [34];
  __va_list_tag _Stack_190;
  undefined1 auStack_170 [176];
  undefined1 auStack_b0 [4];
  int local_ac;
  long local_a8;
  bson_decimal128_t *local_a0;
  undefined8 local_98;
  char *local_90;
  ulong local_88;
  int local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_ac = 0;
  if (dec == (bson_decimal128_t *)0x0) {
    bson_decimal128_from_string_cold_1();
    uVar5 = extraout_AL;
    if (string != (char *)0x0) {
      *(int *)string = (int)dec;
      *(undefined4 *)(string + 4) = extraout_EDX;
      _Stack_190.reg_save_area = auStack_170;
      _Stack_190.overflow_arg_area = auStack_b0;
      _Stack_190.gp_offset = 0x20;
      _Stack_190.fp_offset = 0x30;
      iVar6 = bson_vsnprintf(string + 8,0x1f8,in_RCX,&_Stack_190);
      uVar5 = (undefined1)iVar6;
      string[0x1ff] = '\0';
    }
    return (_Bool)uVar5;
  }
  dec->low = 0;
  dec->high = 0;
  cVar1 = *string;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    uVar12 = CONCAT71((int7)((ulong)unaff_RBX >> 8),cVar1 == '-');
    lVar20 = 1;
    pcVar23 = string + 1;
  }
  else {
    uVar12 = 0;
    lVar20 = 0;
    pcVar23 = string;
  }
  ppuVar7 = __ctype_b_loc();
  puVar2 = *ppuVar7;
  if (((long)string[lVar20] != 0x2e) && ((puVar2[string[lVar20]] & 0x800) == 0)) {
    _Var4 = _dec128_istreq(pcVar23,"inf");
    if ((!_Var4) && (_Var4 = _dec128_istreq(pcVar23,"infinity"), !_Var4)) {
      _Var4 = _dec128_istreq(pcVar23,"nan");
      dec->high = 0x7c00000000000000;
      dec->low = 0;
      return _Var4;
    }
    dec->high = ((ulong)(byte)~(byte)uVar12 << 0x3f) + 0xf800000000000000;
    dec->low = 0;
    return true;
  }
  local_90 = string;
  lVar9 = (long)string[lVar20];
  bVar24 = lVar9 == 0x2e;
  if ((bVar24) || ((puVar2[lVar9] & 0x800) != 0)) {
    psVar13 = (short *)&local_78;
    uVar22 = 0;
    lVar21 = 0;
    uVar11 = 0;
    uVar14 = 0;
    lVar8 = 0;
    bVar15 = false;
    local_88 = 0;
    do {
      pcVar3 = pcVar23 + 1;
      while (pcVar23 = pcVar3, !bVar24) {
        if ((uVar22 < 0x22) && (((char)lVar9 != '0' || (bVar15)))) {
          if (bVar15 == false) {
            lVar21 = lVar8;
          }
          *psVar13 = (char)lVar9 + -0x30;
          psVar13 = psVar13 + 1;
          uVar22 = uVar22 + 1;
          bVar15 = true;
        }
        uVar14 = uVar14 + bVar15;
        uVar11 = uVar11 + local_88;
        lVar8 = lVar8 + 1;
        lVar9 = (long)*pcVar23;
        bVar24 = lVar9 == 0x2e;
        pcVar3 = pcVar23 + 1;
        if ((!bVar24) && ((puVar2[lVar9] & 0x800) == 0)) goto LAB_0010f771;
      }
      if (local_88 != 0) goto LAB_0010f7e4;
      lVar9 = (long)*pcVar23;
      local_88 = 1;
      bVar24 = lVar9 == 0x2e;
    } while ((bVar24) || ((puVar2[lVar9] & 0x800) != 0));
  }
  else {
    local_88 = 0;
    lVar8 = 0;
    uVar14 = 0;
    uVar11 = 0;
    lVar21 = 0;
    uVar22 = 0;
  }
LAB_0010f771:
  if ((lVar8 == 0 & (byte)local_88) != 1) {
    local_a8 = lVar20;
    local_98 = uVar12;
    if (((uint)lVar9 & 0xff | 0x20) == 0x65) {
      local_7c = 0;
      local_a0 = dec;
      iVar6 = __isoc99_sscanf(pcVar23 + 1,"%d%n",&local_ac,&local_7c);
      if (iVar6 == 0 || local_7c == 0) {
        local_a0->high = 0x7c00000000000000;
        local_a0->low = 0;
        return false;
      }
      pcVar23 = pcVar23 + 1 + local_7c;
      dec = local_a0;
    }
    if (*pcVar23 == '\0') {
      local_88 = local_88 & 0xff;
      if (uVar22 == 0) {
        local_78 = local_78 & 0xffffffffffff0000;
        uVar14 = 1;
        uVar10 = 0;
        uVar18 = 1;
        uVar19 = 0;
      }
      else {
        uVar18 = (ulong)uVar22;
        uVar10 = uVar14 + 1;
        pcVar23 = local_90 + lVar21 + uVar14 + local_a8 + local_88;
        do {
          pcVar23 = pcVar23 + -1;
          uVar10 = uVar10 - 1;
        } while (*pcVar23 == '0');
        uVar19 = (ulong)(uVar22 - 1);
      }
      uVar17 = (ulong)local_ac;
      iVar6 = local_ac - (int)uVar11;
      local_ac = -0x1820;
      if (uVar11 - uVar17 < 0x4001) {
        local_ac = iVar6;
      }
      if (uVar11 < uVar17) {
        local_ac = iVar6;
      }
      iVar6 = local_ac;
      if (0x17df < local_ac) {
        do {
          uVar11 = uVar19;
          if (0x21 < uVar11) {
            if (uVar10 != 0) goto LAB_0010f7e4;
            local_ac = 0x17df;
            break;
          }
          local_ac = iVar6 + -1;
          bVar24 = 0x17e0 < iVar6;
          uVar19 = uVar11 + 1;
          iVar6 = local_ac;
        } while (bVar24);
        uVar19 = uVar11 + 1;
      }
      bVar24 = uVar18 < uVar14;
      if ((local_ac < -0x1820) || (uVar18 < uVar14)) {
        iVar6 = 0x17df;
        if (0x17df < local_ac) {
          iVar6 = local_ac;
        }
        iVar6 = iVar6 - local_ac;
        iVar16 = local_ac;
        do {
          if (uVar19 == 0) {
            if (uVar10 != 0) goto LAB_0010f7e4;
            local_ac = -0x1820;
            break;
          }
          if (bVar24) {
            if ((uVar10 != 0) && (local_90[uVar14 + local_88 + local_a8 + -1] != '0'))
            goto LAB_0010f7e4;
            uVar14 = uVar14 - 1;
          }
          else {
            if (*(short *)((long)&local_78 + uVar19 * 2) != 0) goto LAB_0010f7e4;
            uVar19 = uVar19 - 1;
          }
          bVar24 = iVar6 == 0;
          iVar6 = iVar6 + -1;
          if (bVar24) goto LAB_0010f7e4;
          local_ac = iVar16 + 1;
          bVar24 = uVar18 < uVar14;
          bVar15 = iVar16 < -0x1821;
          iVar16 = local_ac;
        } while ((bVar15) || (uVar18 < uVar14));
      }
      if ((uVar10 <= uVar19 + 1) || (local_90[local_88 + 1 + local_a8 + uVar19 + lVar21] == '0')) {
        if (uVar10 == 0) {
          uVar11 = 0;
          local_78 = 0;
        }
        else {
          local_78 = local_78 & 0xffff;
          if (uVar19 < 0x11) {
            uVar11 = 0;
            if (uVar19 != 0) {
              uVar14 = 0;
              do {
                local_78 = (ulong)*(ushort *)((long)&local_78 + uVar14 * 2 + 2) + local_78 * 10;
                uVar14 = uVar14 + 1;
              } while (uVar19 != uVar14);
            }
          }
          else {
            uVar14 = 1;
            uVar11 = local_78;
            if (uVar19 != 0x11) {
              uVar14 = uVar19 - 0x10;
              lVar20 = 0;
              do {
                uVar11 = (ulong)*(ushort *)((long)&local_78 + lVar20 * 2 + 2) + uVar11 * 10;
                lVar20 = lVar20 + 1;
              } while (uVar19 - 0x11 != lVar20);
            }
            local_78 = (ulong)*(ushort *)((long)&local_78 + uVar14 * 2);
            if (uVar14 < uVar19) {
              do {
                lVar20 = uVar14 * 2;
                uVar14 = uVar14 + 1;
                local_78 = (ulong)*(ushort *)((long)&local_78 + lVar20 + 2) + local_78 * 10;
              } while (uVar19 != uVar14);
            }
          }
        }
        uVar14 = 0x1ffffffffffff;
        uVar19 = (uVar11 >> 0x20) * 0x5d8a0000;
        uVar10 = (uVar11 & 0xffffffff) * 0x5d8a0000;
        uVar18 = (uVar10 >> 0x20) + (uVar19 & 0xffffffff) + (uVar11 & 0xffffffff) * 0x1634578;
        uVar10 = (uVar10 & 0xffffffff) + local_78 + (uVar18 << 0x20);
        uVar11 = (uVar18 >> 0x20) + (uVar19 >> 0x20) + (uVar11 >> 0x20) * 0x1634578 +
                 (ulong)(uVar10 < local_78);
        if ((uVar11 & 0x2000000000000) == 0) {
          uVar19 = (ulong)(local_ac + 0x1820U & 0x3fff) << 0x31 | dec->high;
        }
        else {
          uVar19 = (ulong)(local_ac + 0x1820U & 0xffff) << 0x2f | dec->high | 0x6000000000000000;
          uVar14 = 0x7fffffffffff;
        }
        uVar19 = uVar11 & uVar14 | uVar19;
        dec->high = uVar19;
        dec->low = uVar10;
        if ((char)local_98 != '\0') {
          dec->high = uVar19 | 0x8000000000000000;
          return true;
        }
        return true;
      }
    }
  }
LAB_0010f7e4:
  dec->high = 0x7c00000000000000;
  dec->low = 0;
  return false;
}

Assistant:

bool
bson_decimal128_from_string (const char *string,     /* IN */
                             bson_decimal128_t *dec) /* OUT */
{
   _bson_uint128_6464_t significand = {0};

   const char *str_read = string; /* Read pointer for consuming str. */

   /* Parsing state tracking */
   bool is_negative = false;
   bool saw_radix = false;
   bool includes_sign = false; /* True if the input string contains a sign. */
   bool found_nonzero = false;

   size_t significant_digits = 0; /* Total number of significant digits
                                   * (no leading or trailing zero) */
   size_t ndigits_read = 0;       /* Total number of significand digits read */
   size_t ndigits = 0;        /* Total number of digits (no leading zeros) */
   size_t radix_position = 0; /* The number of the digits after radix */
   size_t first_nonzero = 0;  /* The index of the first non-zero in *str* */

   uint16_t digits[BSON_DECIMAL128_MAX_DIGITS] = {0};
   uint16_t ndigits_stored = 0;      /* The number of digits in digits */
   uint16_t *digits_insert = digits; /* Insertion pointer for digits */
   size_t first_digit = 0;           /* The index of the first non-zero digit */
   size_t last_digit = 0;            /* The index of the last digit */

   int32_t exponent = 0;
   uint64_t significand_high = 0; /* The high 17 digits of the significand */
   uint64_t significand_low = 0;  /* The low 17 digits of the significand */
   uint16_t biased_exponent = 0;  /* The biased exponent */

   BSON_ASSERT (dec);
   dec->high = 0;
   dec->low = 0;

   if (*str_read == '+' || *str_read == '-') {
      is_negative = *(str_read++) == '-';
      includes_sign = true;
   }

   /* Check for Infinity or NaN */
   if (!isdigit (*str_read) && *str_read != '.') {
      if (_dec128_istreq (str_read, "inf") ||
          _dec128_istreq (str_read, "infinity")) {
         BSON_DECIMAL128_SET_INF (*dec, is_negative);
         return true;
      } else if (_dec128_istreq (str_read, "nan")) {
         BSON_DECIMAL128_SET_NAN (*dec);
         return true;
      }

      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Read digits */
   while (isdigit (*str_read) || *str_read == '.') {
      if (*str_read == '.') {
         if (saw_radix) {
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }

         saw_radix = true;
         str_read++;
         continue;
      }

      if (ndigits_stored < 34) {
         if (*str_read != '0' || found_nonzero) {
            if (!found_nonzero) {
               first_nonzero = ndigits_read;
            }

            found_nonzero = true;
            *(digits_insert++) = *(str_read) - '0'; /* Only store 34 digits */
            ndigits_stored++;
         }
      }

      if (found_nonzero) {
         ndigits++;
      }

      if (saw_radix) {
         radix_position++;
      }

      ndigits_read++;
      str_read++;
   }

   if (saw_radix && !ndigits_read) {
      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Read exponent if exists */
   if (*str_read == 'e' || *str_read == 'E') {
      int nread = 0;
#ifdef _MSC_VER
#define SSCANF sscanf_s
#else
#define SSCANF sscanf
#endif
      int read_exponent = SSCANF (++str_read, "%d%n", &exponent, &nread);
      str_read += nread;

      if (!read_exponent || nread == 0) {
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

#undef SSCANF
   }

   if (*str_read) {
      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Done reading input. */
   /* Find first non-zero digit in digits */
   first_digit = 0;

   if (!ndigits_stored) { /* value is zero */
      first_digit = 0;
      last_digit = 0;
      digits[0] = 0;
      ndigits = 1;
      ndigits_stored = 1;
      significant_digits = 0;
   } else {
      last_digit = ndigits_stored - 1;
      significant_digits = ndigits;
      /* Mark trailing zeros as non-significant */
      while (string[first_nonzero + significant_digits - 1 + includes_sign +
                    saw_radix] == '0') {
         significant_digits--;
      }
   }


   /* Normalization of exponent */
   /* Correct exponent based on radix position, and shift significand as needed
    */
   /* to represent user input */

   /* Overflow prevention */
   if (exponent <= radix_position && radix_position - exponent > (1 << 14)) {
      exponent = BSON_DECIMAL128_EXPONENT_MIN;
   } else {
      exponent -= radix_position;
   }

   /* Attempt to normalize the exponent */
   while (exponent > BSON_DECIMAL128_EXPONENT_MAX) {
      /* Shift exponent to significand and decrease */
      last_digit++;

      if (last_digit - first_digit > BSON_DECIMAL128_MAX_DIGITS) {
         /* The exponent is too great to shift into the significand. */
         if (significant_digits == 0) {
            /* Value is zero, we are allowed to clamp the exponent. */
            exponent = BSON_DECIMAL128_EXPONENT_MAX;
            break;
         }

         /* Overflow is not permitted, error. */
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

      exponent--;
   }

   while (exponent < BSON_DECIMAL128_EXPONENT_MIN || ndigits_stored < ndigits) {
      /* Shift last digit */
      if (last_digit == 0) {
         /* underflow is not allowed, but zero clamping is */
         if (significant_digits == 0) {
            exponent = BSON_DECIMAL128_EXPONENT_MIN;
            break;
         }

         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

      if (ndigits_stored < ndigits) {
         if (string[ndigits - 1 + includes_sign + saw_radix] - '0' != 0 &&
             significant_digits != 0) {
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }

         ndigits--; /* adjust to match digits not stored */
      } else {
         if (digits[last_digit] != 0) {
            /* Inexact rounding is not allowed. */
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }


         last_digit--; /* adjust to round */
      }

      if (exponent < BSON_DECIMAL128_EXPONENT_MAX) {
         exponent++;
      } else {
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }
   }

   /* Round */
   /* We've normalized the exponent, but might still need to round. */
   if (last_digit - first_digit + 1 < significant_digits) {
      uint8_t round_digit;

      /* There are non-zero digits after last_digit that need rounding. */
      /* We round to nearest, ties to even */
      round_digit =
         string[first_nonzero + last_digit + includes_sign + saw_radix + 1] -
         '0';

      if (round_digit != 0) {
         /* Inexact (non-zero) rounding is not allowed */
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }
   }

   /* Encode significand */
   significand_high = 0,   /* The high 17 digits of the significand */
      significand_low = 0; /* The low 17 digits of the significand */

   if (significant_digits == 0) { /* read a zero */
      significand_high = 0;
      significand_low = 0;
   } else if (last_digit - first_digit < 17) {
      size_t d_idx = first_digit;
      significand_low = digits[d_idx++];

      for (; d_idx <= last_digit; d_idx++) {
         significand_low *= 10;
         significand_low += digits[d_idx];
         significand_high = 0;
      }
   } else {
      size_t d_idx = first_digit;
      significand_high = digits[d_idx++];

      for (; d_idx <= last_digit - 17; d_idx++) {
         significand_high *= 10;
         significand_high += digits[d_idx];
      }

      significand_low = digits[d_idx++];

      for (; d_idx <= last_digit; d_idx++) {
         significand_low *= 10;
         significand_low += digits[d_idx];
      }
   }

   _mul_64x64 (significand_high, 100000000000000000ull, &significand);
   significand.low += significand_low;

   if (significand.low < significand_low) {
      significand.high += 1;
   }


   biased_exponent = (exponent + (int16_t) BSON_DECIMAL128_EXPONENT_BIAS);

   /* Encode combination, exponent, and significand. */
   if ((significand.high >> 49) & 1) {
      /* Encode '11' into bits 1 to 3 */
      dec->high |= (0x3ull << 61);
      dec->high |= (biased_exponent & 0x3fffull) << 47;
      dec->high |= significand.high & 0x7fffffffffffull;
   } else {
      dec->high |= (biased_exponent & 0x3fffull) << 49;
      dec->high |= significand.high & 0x1ffffffffffffull;
   }

   dec->low = significand.low;

   /* Encode sign */
   if (is_negative) {
      dec->high |= 0x8000000000000000ull;
   }

   return true;
}